

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void parse_feature_tweaks(options_i *options,vw *all)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first_00;
  byte bVar1;
  bool bVar2;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ptVar3;
  vw *all_00;
  hash_func_t required_length;
  size_type sVar4;
  ostream *poVar5;
  reference pcVar6;
  uchar *puVar7;
  undefined8 uVar8;
  byte *pbVar9;
  reference pbVar10;
  char *pcVar11;
  ulong uVar12;
  reference pvVar13;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  long *in_RDI;
  size_t id_1;
  size_t index;
  size_t previous;
  char delimiter;
  string PATH;
  string path;
  iterator __end3_3;
  iterator __begin3_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_3;
  size_t i_14;
  uchar c;
  size_t i_13;
  stringstream __msg_3;
  size_t i_12;
  uchar new_namespace;
  bool operator_found;
  size_t operator_pos;
  size_t arg_len;
  string argument;
  iterator arg_iter;
  size_t i_11;
  char character_2;
  const_iterator __end4_2;
  const_iterator __begin4_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range4_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *keep;
  iterator __end3_2;
  iterator __begin3_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_2;
  const_iterator j_2;
  iterator i_10;
  size_t i_9;
  char character_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range4_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ignore_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  const_iterator j_1;
  iterator i_8;
  char character;
  const_iterator __end4;
  const_iterator __begin4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ignore;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  const_iterator j;
  iterator i_7;
  size_t i_6;
  size_t len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_5;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  size_t sorted_cnt;
  size_t removed_cnt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exp_inter;
  iterator i_4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exp_cubic;
  iterator i_3;
  iterator i_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expanded_interactions;
  stringstream __msg_2;
  size_t i_1;
  stringstream __msg_1;
  size_t i;
  stringstream __msg;
  size_t id;
  option_group_definition feature_options;
  string q_colon;
  string affix;
  bool leave_duplicate_interactions;
  bool noconstant;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dictionary_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dictionary_nses;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  redefines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignore_linears;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignores;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interactions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cubics;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  quadratics;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  spelling_ns;
  uint32_t new_bits;
  string hash_function;
  string *in_stack_ffffffffffffd158;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffd160;
  string *in_stack_ffffffffffffd168;
  typed_option<unsigned_int> *in_stack_ffffffffffffd170;
  string *in_stack_ffffffffffffd178;
  undefined8 in_stack_ffffffffffffd180;
  int iVar14;
  char *in_stack_ffffffffffffd188;
  allocator *paVar15;
  vw_exception *in_stack_ffffffffffffd190;
  undefined7 in_stack_ffffffffffffd1a0;
  undefined1 in_stack_ffffffffffffd1a7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffd1a8;
  undefined6 in_stack_ffffffffffffd1b0;
  undefined1 in_stack_ffffffffffffd1b6;
  undefined1 in_stack_ffffffffffffd1b7;
  const_iterator in_stack_ffffffffffffd1b8;
  undefined7 in_stack_ffffffffffffd1c8;
  undefined1 in_stack_ffffffffffffd1cf;
  string *in_stack_ffffffffffffd1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffd1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffd200;
  undefined1 in_stack_ffffffffffffd227;
  uint32_t *in_stack_ffffffffffffd228;
  long *plVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffd230;
  undefined8 in_stack_ffffffffffffd238;
  undefined1 uVar17;
  char *in_stack_ffffffffffffd240;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ptVar18;
  undefined7 in_stack_ffffffffffffd248;
  undefined1 in_stack_ffffffffffffd24f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffd250;
  size_t *in_stack_ffffffffffffd2d8;
  size_t *in_stack_ffffffffffffd2e0;
  undefined8 in_stack_ffffffffffffd2e8;
  iterator in_stack_ffffffffffffd2f0;
  undefined7 in_stack_ffffffffffffd328;
  undefined1 in_stack_ffffffffffffd32f;
  vw *in_stack_ffffffffffffd330;
  byte local_2c02;
  string *err_msg;
  string *str;
  string local_2740 [32];
  ulong local_2720;
  string local_2718 [32];
  string local_26f8 [32];
  long local_26d8;
  long local_26d0;
  undefined1 local_26c2;
  allocator local_26c1;
  string local_26c0 [39];
  allocator local_2699;
  string local_2698 [39];
  allocator local_2671;
  string local_2670 [32];
  string local_2650 [32];
  string local_2630 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2610;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2608;
  undefined1 *local_2600;
  allocator local_25f1;
  string local_25f0 [39];
  allocator local_25c9;
  string local_25c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_25a8;
  ulong local_25a0;
  byte local_2591;
  ulong local_2590;
  undefined1 local_2581;
  stringstream local_2560 [16];
  stringstream local_2550 [232];
  string *in_stack_ffffffffffffdb98;
  vw *in_stack_ffffffffffffdba0;
  ulong local_23d8;
  uchar local_23ca;
  ulong local_23c8;
  string local_23b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2398;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2390;
  ulong local_2388;
  allocator local_2379;
  string local_2378 [39];
  char local_2351;
  undefined8 local_2350;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2348;
  reference local_2340;
  reference local_2338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2330;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2328;
  undefined1 *local_2320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2318;
  char *local_2310;
  undefined8 local_2308;
  undefined8 local_2300;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_22f8;
  string local_22f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_22d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_22c8;
  ulong local_22c0;
  allocator local_22b1;
  string local_22b0 [39];
  char local_2289;
  undefined8 local_2288;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2280;
  reference local_2278;
  reference local_2270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2268;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2260;
  undefined1 *local_2258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2250;
  char *local_2248;
  undefined8 local_2240;
  undefined8 local_2238;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2230;
  string local_2228 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2208;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2200;
  allocator local_21f1;
  string local_21f0 [39];
  char local_21c9;
  undefined8 local_21c8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_21c0;
  reference local_21b8;
  reference local_21b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_21a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_21a0;
  undefined1 *local_2198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2190;
  char *local_2188;
  undefined8 local_2180;
  undefined8 local_2178;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2170;
  string local_2168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2148;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2140;
  allocator local_2131;
  string local_2130 [32];
  ulong local_2110;
  long local_2108;
  reference local_2100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20e8;
  ulong local_20e0;
  ulong local_20d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20b8;
  allocator local_20a1;
  string local_20a0 [56];
  string local_2068 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2048;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2040;
  allocator local_2031;
  string local_2030 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2000;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1ff8;
  allocator local_1fe1;
  string local_1fe0 [56];
  string local_1fa8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f88;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f80;
  allocator local_1f71;
  string local_1f70 [39];
  allocator local_1f49;
  string local_1f48 [56];
  string local_1f10 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1ef0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1ee8;
  allocator local_1ed9;
  string local_1ed8 [37];
  byte local_1eb3;
  byte local_1eb2;
  allocator local_1eb1;
  string local_1eb0 [37];
  byte local_1e8b;
  byte local_1e8a;
  allocator local_1e89;
  string local_1e88 [37];
  byte local_1e63;
  byte local_1e62;
  allocator local_1e61;
  string local_1e60 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e40;
  undefined1 local_1e21;
  stringstream local_1e00 [16];
  ostream local_1df0;
  allocator local_1c71;
  string local_1c70 [63];
  allocator local_1c31;
  string local_1c30 [56];
  string local_1bf8 [32];
  ulong local_1bd8;
  undefined1 local_1bc9;
  stringstream local_1ba8 [16];
  ostream local_1b98;
  allocator local_1a19;
  string local_1a18 [39];
  allocator local_19f1;
  string local_19f0 [56];
  string local_19b8 [32];
  ulong local_1998;
  undefined1 local_1989;
  stringstream local_1968 [16];
  ostream local_1958;
  allocator local_17d9;
  string local_17d8 [39];
  allocator local_17b1;
  string local_17b0 [32];
  string local_1790 [39];
  allocator local_1769;
  string local_1768 [32];
  string local_1748 [32];
  ulong local_1728;
  undefined1 local_1719 [40];
  allocator local_16f1;
  string local_16f0 [39];
  allocator local_16c9;
  string local_16c8 [32];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_16a8;
  allocator local_1601;
  string local_1600 [39];
  allocator local_15d9;
  string local_15d8 [199];
  allocator local_1511;
  string local_1510 [39];
  allocator local_14e9;
  string local_14e8 [39];
  allocator local_14c1;
  string local_14c0 [199];
  allocator local_13f9;
  string local_13f8 [39];
  allocator local_13d1;
  string local_13d0 [199];
  allocator local_1309;
  string local_1308 [39];
  allocator local_12e1;
  string local_12e0 [199];
  allocator local_1219;
  string local_1218 [39];
  allocator local_11f1;
  string local_11f0 [32];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_11d0;
  allocator local_1129;
  string local_1128 [39];
  allocator local_1101;
  string local_1100 [199];
  allocator local_1039;
  string local_1038 [39];
  allocator local_1011;
  string local_1010 [32];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ff0;
  allocator local_f49;
  string local_f48 [39];
  allocator local_f21;
  string local_f20 [32];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f00;
  allocator local_e59;
  string local_e58 [39];
  allocator local_e31;
  string local_e30 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e10;
  allocator local_d69;
  string local_d68 [39];
  undefined1 local_d41 [200];
  allocator local_c79;
  string local_c78 [39];
  allocator local_c51;
  string local_c50 [199];
  allocator local_b89;
  string local_b88 [39];
  allocator local_b61;
  string local_b60 [199];
  allocator local_a99;
  string local_a98 [39];
  allocator local_a71;
  string local_a70 [39];
  allocator local_a49;
  string local_a48 [199];
  allocator local_981;
  string local_980 [39];
  allocator local_959;
  string local_958 [199];
  allocator local_891;
  string local_890 [39];
  allocator local_869;
  string local_868 [39];
  allocator local_841;
  string local_840 [199];
  allocator local_779;
  string local_778 [39];
  allocator local_751;
  string local_750 [32];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_730;
  allocator local_689;
  string local_688 [39];
  allocator local_661;
  string local_660 [32];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_640;
  allocator local_599;
  string local_598 [39];
  allocator local_571;
  string local_570 [32];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_550;
  allocator local_4a9;
  string local_4a8 [39];
  allocator local_481;
  string local_480 [32];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_460;
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [32];
  typed_option<unsigned_int> local_370;
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  allocator local_1d9;
  string local_1d8 [32];
  undefined1 local_1b8 [56];
  string local_180 [32];
  string local_160 [39];
  byte local_139;
  undefined1 local_138 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120 [2];
  undefined1 local_f0 [24];
  undefined1 local_d8 [24];
  undefined1 local_c0 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  uint local_48;
  allocator local_31;
  string local_30 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  long *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"strings",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x135514);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x135521);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x13552e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x13553b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x135548);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x135555);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x135562);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x13556f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x13557c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x135589);
  std::__cxx11::string::string(local_160);
  std::__cxx11::string::string(local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"Feature options",&local_1d9);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"hash",&local_2a1);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffd168,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd160);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(&local_280,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2c8,"how to hash the features. Available options: strings, all",&local_2c9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"hash_seed",&local_391);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffd168,(uint *)in_stack_ffffffffffffd160)
  ;
  VW::config::typed_option<unsigned_int>::keep(&local_370,true);
  VW::config::typed_option<unsigned_int>::default_value
            (in_stack_ffffffffffffd170,(uint)((ulong)in_stack_ffffffffffffd168 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"seed for hash function",&local_3b9);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<unsigned_int> *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"ignore",&local_481);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffd168,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd160);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(&local_460,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4a8,"ignore namespaces beginning with character <arg>",&local_4a9);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"ignore_linear",&local_571);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffd168,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd160);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(&local_550,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_598,"ignore namespaces beginning with character <arg> for linear terms only",
             &local_599);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_660,"keep",&local_661);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffd168,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd160);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(&local_640,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_688,"keep namespaces beginning with character <arg>",&local_689);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_750,"redefine",&local_751);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffd168,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd160);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(&local_730,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_778,
             "redefine namespaces beginning with characters of string S as namespace N. <arg> shall be in form \'N:=S\' where := is operator. Empty N or S are treated as default namespace. Use \':\' as a wildcard in S."
             ,&local_779);
  ptVar3 = VW::config::
           typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(ptVar3,true);
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_840,"bit_precision",&local_841);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffd168,(uint *)in_stack_ffffffffffffd160)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_868,"b",&local_869);
  VW::config::typed_option<unsigned_int>::short_name
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_890,"number of bits in the feature table",&local_891);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<unsigned_int> *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_958,"noconstant",&local_959);
  VW::config::make_option<bool>(in_stack_ffffffffffffd168,(bool *)in_stack_ffffffffffffd160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_980,"Don\'t add a constant feature",&local_981);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<bool> *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a48,"constant",&local_a49);
  VW::config::make_option<float>(in_stack_ffffffffffffd168,(float *)in_stack_ffffffffffffd160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a70,"C",&local_a71);
  VW::config::typed_option<float>::short_name
            ((typed_option<float> *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a98,"Set initial value of constant",&local_a99);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<float> *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b60,"ngram",&local_b61);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffd168,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b88,
             "Generate N grams. To generate N grams for a single namespace \'foo\', arg should be fN."
             ,&local_b89);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c50,"skips",&local_c51);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffd168,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c78,
             "Generate skips in N grams. This in conjunction with the ngram tag can be used to generate generalized n-skip-k-gram. To generate n-skips for a single namespace \'foo\', arg should be fN."
             ,&local_c79);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  all_00 = (vw *)VW::config::option_group_definition::
                 add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                           ((option_group_definition *)
                            CONCAT17(in_stack_ffffffffffffd1b7,
                                     CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
                            (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffd1a8._M_current);
  str = (string *)local_d41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_d41 + 1),"feature_limit",(allocator *)str);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffd168,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d68,
             "limit to N features. To apply to a single namespace \'foo\', arg should be fN",
             &local_d69);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e30,"affix",&local_e31);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffd168,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd160);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(&local_e10,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e58,
             "generate prefixes/suffixes of features; argument \'+2a,-3b,+1\' means generate 2-char prefixes for namespace a, 3-char suffixes for b and 1 char prefixes for default namespace"
             ,&local_e59);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f20,"spelling",&local_f21);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffd168,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd160);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(&local_f00,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f48,
             "compute spelling features for a give namespace (use \'_\' for default namespace)",
             &local_f49);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1010,"dictionary",&local_1011);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffd168,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd160);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(&local_ff0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1038,
             "read a dictionary for additional features (arg either \'x:file\' or just \'file\')",
             &local_1039);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1100,"dictionary_path",&local_1101);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffd168,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1128,
             "look in this directory for dictionaries; defaults to current directory or env{PATH}",
             &local_1129);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11f0,"interactions",&local_11f1);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffd168,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd160);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(&local_11d0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1218,"Create feature interactions of any level between namespaces.",&local_1219);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12e0,"permutations",&local_12e1);
  VW::config::make_option<bool>(in_stack_ffffffffffffd168,(bool *)in_stack_ffffffffffffd160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1308,
             "Use permutations instead of combinations for feature interactions of same namespace.",
             &local_1309);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<bool> *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_13d0,"leave_duplicate_interactions",&local_13d1);
  VW::config::make_option<bool>(in_stack_ffffffffffffd168,(bool *)in_stack_ffffffffffffd160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_13f8,
             "Don\'t remove interactions with duplicate combinations of namespaces. For ex. this is a duplicate: \'-q ab -q ba\' and a lot more in \'-q ::\'."
             ,&local_13f9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<bool> *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14c0,"quadratic",&local_14c1);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffd168,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14e8,"q",&local_14e9);
  ptVar3 = VW::config::
           typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::short_name((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(ptVar3,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1510,"Create and use quadratic features",&local_1511);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15d8,"q:",&local_15d9);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffd168,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1600,": corresponds to a wildcard for all printable characters",&local_1601);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffd1a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16c8,"cubic",&local_16c9);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffd168,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd160);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(&local_16a8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16f0,"Create and use cubic features",&local_16f1);
  ptVar3 = VW::config::
           typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffd1b7,
                      CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffd1a8._M_current);
  std::__cxx11::string::~string(local_16f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_16f1);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_16c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_16c9);
  std::__cxx11::string::~string(local_1600);
  std::allocator<char>::~allocator((allocator<char> *)&local_1601);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_15d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_15d9);
  std::__cxx11::string::~string(local_1510);
  std::allocator<char>::~allocator((allocator<char> *)&local_1511);
  std::__cxx11::string::~string(local_14e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14e9);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_14c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_14c1);
  std::__cxx11::string::~string(local_13f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_13f9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_13d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_13d1);
  std::__cxx11::string::~string(local_1308);
  std::allocator<char>::~allocator((allocator<char> *)&local_1309);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_12e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_12e1);
  std::__cxx11::string::~string(local_1218);
  std::allocator<char>::~allocator((allocator<char> *)&local_1219);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_11f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11f1);
  std::__cxx11::string::~string(local_1128);
  std::allocator<char>::~allocator((allocator<char> *)&local_1129);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_1100);
  std::allocator<char>::~allocator((allocator<char> *)&local_1101);
  std::__cxx11::string::~string(local_1038);
  std::allocator<char>::~allocator((allocator<char> *)&local_1039);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_1010);
  std::allocator<char>::~allocator((allocator<char> *)&local_1011);
  std::__cxx11::string::~string(local_f48);
  std::allocator<char>::~allocator((allocator<char> *)&local_f49);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_f20);
  std::allocator<char>::~allocator((allocator<char> *)&local_f21);
  std::__cxx11::string::~string(local_e58);
  std::allocator<char>::~allocator((allocator<char> *)&local_e59);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_e30);
  std::allocator<char>::~allocator((allocator<char> *)&local_e31);
  std::__cxx11::string::~string(local_d68);
  std::allocator<char>::~allocator((allocator<char> *)&local_d69);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string((string *)(local_d41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_d41);
  std::__cxx11::string::~string(local_c78);
  std::allocator<char>::~allocator((allocator<char> *)&local_c79);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_c50);
  std::allocator<char>::~allocator((allocator<char> *)&local_c51);
  std::__cxx11::string::~string(local_b88);
  std::allocator<char>::~allocator((allocator<char> *)&local_b89);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_b60);
  std::allocator<char>::~allocator((allocator<char> *)&local_b61);
  std::__cxx11::string::~string(local_a98);
  std::allocator<char>::~allocator((allocator<char> *)&local_a99);
  std::__cxx11::string::~string(local_a70);
  std::allocator<char>::~allocator((allocator<char> *)&local_a71);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_a48);
  std::allocator<char>::~allocator((allocator<char> *)&local_a49);
  std::__cxx11::string::~string(local_980);
  std::allocator<char>::~allocator((allocator<char> *)&local_981);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_958);
  std::allocator<char>::~allocator((allocator<char> *)&local_959);
  std::__cxx11::string::~string(local_890);
  std::allocator<char>::~allocator((allocator<char> *)&local_891);
  std::__cxx11::string::~string(local_868);
  std::allocator<char>::~allocator((allocator<char> *)&local_869);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  std::__cxx11::string::~string(local_778);
  std::allocator<char>::~allocator((allocator<char> *)&local_779);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_750);
  std::allocator<char>::~allocator((allocator<char> *)&local_751);
  std::__cxx11::string::~string(local_688);
  std::allocator<char>::~allocator((allocator<char> *)&local_689);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_660);
  std::allocator<char>::~allocator((allocator<char> *)&local_661);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  (**(code **)*local_8)(local_8,local_1b8);
  required_length =
       getHasher((string *)CONCAT17(in_stack_ffffffffffffd32f,in_stack_ffffffffffffd328));
  plVar16 = local_8;
  *(hash_func_t *)(*(long *)&(local_10->super_base_option).m_name + 0x200) = required_length;
  err_msg = (string *)local_1719;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1719 + 1),"spelling",(allocator *)err_msg);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_1719 + 1);
  std::__cxx11::string::~string((string *)(local_1719 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1719);
  if ((bVar1 & 1) != 0) {
    for (local_1728 = 0; uVar12 = local_1728,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_60), uVar12 < sVar4; local_1728 = local_1728 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_60,local_1728);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8));
      pvVar13 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_60,local_1728);
      std::__cxx11::string::operator=((string *)pvVar13,local_1748);
      std::__cxx11::string::~string(local_1748);
      pvVar13 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_60,local_1728);
      pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)pvVar13);
      ptVar18 = local_10;
      if (*pcVar11 == '_') {
        local_10[0x2b].super_base_option.m_help.field_2._M_local_buf[0] = '\x01';
      }
      else {
        pvVar13 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&local_60,local_1728);
        pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)pvVar13);
        ptVar18[0x2b].super_base_option.m_name.field_2._M_local_buf[(long)*pcVar11 + 8] = '\x01';
      }
    }
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1768,"affix",&local_1769);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_1768);
  std::__cxx11::string::~string(local_1768);
  std::allocator<char>::~allocator((allocator<char> *)&local_1769);
  if ((bVar1 & 1) != 0) {
    spoof_hex_encoded_namespaces
              ((string *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8));
    parse_affix_argument(all_00,str);
    std::__cxx11::string::~string(local_1790);
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17b0,"ngram",&local_17b1);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_17b0);
  std::__cxx11::string::~string(local_17b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17b1);
  plVar16 = local_8;
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_17d8,"sort_features",&local_17d9);
    bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_17d8);
    std::__cxx11::string::~string(local_17d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_17d9);
    iVar14 = (int)((ulong)in_stack_ffffffffffffd180 >> 0x20);
    if ((bVar1 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_1968);
      std::operator<<(&local_1958,"ngram is incompatible with sort_features.");
      local_1989 = 1;
      uVar8 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_ffffffffffffd190,in_stack_ffffffffffffd188,iVar14,
                 in_stack_ffffffffffffd178);
      local_1989 = 0;
      __cxa_throw(uVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    for (local_1998 = 0; uVar12 = local_1998,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_10[10].m_location), uVar12 < sVar4; local_1998 = local_1998 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_10[10].m_location,local_1998);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8));
      pvVar13 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_10[10].m_location,local_1998);
      std::__cxx11::string::operator=((string *)pvVar13,local_19b8);
      std::__cxx11::string::~string(local_19b8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffd1b7,
                         CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd1a8._M_current);
    compile_gram(in_stack_ffffffffffffd250,
                 (uint32_t *)CONCAT17(in_stack_ffffffffffffd24f,in_stack_ffffffffffffd248),
                 in_stack_ffffffffffffd240,SUB81((ulong)in_stack_ffffffffffffd238 >> 0x38,0));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffd170);
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_19f0,"skips",&local_19f1);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_19f0);
  std::__cxx11::string::~string(local_19f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_19f1);
  plVar16 = local_8;
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a18,"ngram",&local_1a19);
    bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_1a18);
    std::__cxx11::string::~string(local_1a18);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a19);
    iVar14 = (int)((ulong)in_stack_ffffffffffffd180 >> 0x20);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_1ba8);
      std::operator<<(&local_1b98,"You can not skip unless ngram is > 1");
      local_1bc9 = 1;
      uVar8 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_ffffffffffffd190,in_stack_ffffffffffffd188,iVar14,
                 in_stack_ffffffffffffd178);
      local_1bc9 = 0;
      __cxa_throw(uVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_1bd8 = 0;
    while( true ) {
      uVar12 = local_1bd8;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_10[10].m_default_value);
      uVar17 = (undefined1)((ulong)in_stack_ffffffffffffd238 >> 0x38);
      if (sVar4 <= uVar12) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_10[10].m_default_value,local_1bd8);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8));
      pvVar13 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_10[10].m_default_value,local_1bd8);
      std::__cxx11::string::operator=((string *)pvVar13,local_1bf8);
      std::__cxx11::string::~string(local_1bf8);
      local_1bd8 = local_1bd8 + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffd1b7,
                         CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd1a8._M_current);
    compile_gram(in_stack_ffffffffffffd250,
                 (uint32_t *)CONCAT17(in_stack_ffffffffffffd24f,in_stack_ffffffffffffd248),
                 in_stack_ffffffffffffd240,(bool)uVar17);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffd170);
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c30,"feature_limit",&local_1c31);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_1c30);
  std::__cxx11::string::~string(local_1c30);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c31);
  if ((bVar1 & 1) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffd1b7,
                         CONCAT16(in_stack_ffffffffffffd1b6,in_stack_ffffffffffffd1b0)),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd1a8._M_current);
    compile_limits(in_stack_ffffffffffffd230,in_stack_ffffffffffffd228,
                   (bool)in_stack_ffffffffffffd227);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffd170);
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c70,"bit_precision",&local_1c71);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_1c70);
  std::__cxx11::string::~string(local_1c70);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c71);
  iVar14 = (int)((ulong)in_stack_ffffffffffffd180 >> 0x20);
  if ((bVar1 & 1) != 0) {
    if ((((local_10->super_base_option).m_short_name.field_0x4 & 1) == 0) &&
       (local_48 != *(uint *)&(local_10->super_base_option).m_short_name)) {
      std::__cxx11::stringstream::stringstream(local_1e00);
      poVar5 = std::operator<<(&local_1df0,"Number of bits is set to ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_48);
      poVar5 = std::operator<<(poVar5," and ");
      poVar5 = (ostream *)
               std::ostream::operator<<(poVar5,*(uint *)&(local_10->super_base_option).m_short_name)
      ;
      std::operator<<(poVar5," by argument and model.  That does not work.");
      local_1e21 = 1;
      uVar8 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_ffffffffffffd190,in_stack_ffffffffffffd188,iVar14,
                 in_stack_ffffffffffffd178);
      local_1e21 = 0;
      __cxa_throw(uVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    (local_10->super_base_option).m_short_name.field_0x4 = 0;
    *(uint *)&(local_10->super_base_option).m_short_name = local_48;
    VW::validate_num_bits(in_stack_ffffffffffffd330);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x139033);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffd170);
  local_1e62 = 0;
  local_1e63 = 0;
  local_1e8a = 0;
  local_1e8b = 0;
  local_1eb2 = 0;
  local_1eb3 = 0;
  if (((!bVar2) ||
      (bVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffd170), !bVar2)) ||
     (bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffd170), !bVar2)) {
    plVar16 = local_8;
    std::allocator<char>::allocator();
    local_1e62 = 1;
    std::__cxx11::string::string(local_1e60,"quadratic",&local_1e61);
    local_1e63 = 1;
    bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_1e60);
    plVar16 = local_8;
    local_2c02 = 1;
    if ((bVar1 & 1) != 0) goto LAB_0013926c;
    std::allocator<char>::allocator();
    local_1e8a = 1;
    std::__cxx11::string::string(local_1e88,"cubic",&local_1e89);
    local_1e8b = 1;
    bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_1e88);
    plVar16 = local_8;
    local_2c02 = 1;
    if ((bVar1 & 1) != 0) goto LAB_0013926c;
    std::allocator<char>::allocator();
    local_1eb2 = 1;
    std::__cxx11::string::string(local_1eb0,"interactions",&local_1eb1);
    local_1eb3 = 1;
    bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_1eb0);
    local_2c02 = 1;
    if ((bVar1 & 1) != 0) goto LAB_0013926c;
  }
  local_2c02 = interactions_settings_doubled;
LAB_0013926c:
  if ((local_1eb3 & 1) != 0) {
    std::__cxx11::string::~string(local_1eb0);
  }
  if ((local_1eb2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1eb1);
  }
  if ((local_1e8b & 1) != 0) {
    std::__cxx11::string::~string(local_1e88);
  }
  if ((local_1e8a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1e89);
  }
  if ((local_1e63 & 1) != 0) {
    std::__cxx11::string::~string(local_1e60);
  }
  if ((local_1e62 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1e61);
  }
  if ((local_2c02 & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                             "WARNING: model file has set of {-q, --cubic, --interactions} settings stored, but they\'ll be OVERRIDEN by set of {-q, --cubic, --interactions} settings from command line."
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffd170);
    if (!bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x13938b);
    }
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffd170);
    if (!bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x139505);
    }
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffd170);
    if (!bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x139531);
    }
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ed8,"quadratic",&local_1ed9);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_1ed8);
  std::__cxx11::string::~string(local_1ed8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ed9);
  if ((bVar1 & 1) != 0) {
    if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
      std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                      "creating quadratic features for pairs: ");
    }
    local_1ee8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffd158);
    while( true ) {
      local_1ef0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffd158);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffd160,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffd158);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_1ee8);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8));
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_1ee8);
      std::__cxx11::string::operator=((string *)pbVar10,local_1f10);
      std::__cxx11::string::~string(local_1f10);
      if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
        ptVar18 = local_10 + 1;
        pbVar10 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_1ee8);
        poVar5 = std::operator<<((ostream *)&(ptVar18->super_base_option).m_help.field_2,
                                 (string *)pbVar10);
        std::operator<<(poVar5," ");
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1ee8);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1f48,"error, quadratic features must involve two sets.",&local_1f49);
    INTERACTIONS::expand_interactions
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ptVar3,(size_t)required_length,err_msg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffd170,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffd168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffd170);
    std::__cxx11::string::~string(local_1f48);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f49);
    if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
      std::ostream::operator<<
                (&local_10[1].super_base_option.m_help.field_2,
                 std::endl<char,std::char_traits<char>>);
    }
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f70,"cubic",&local_1f71);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_1f70);
  std::__cxx11::string::~string(local_1f70);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f71);
  if ((bVar1 & 1) != 0) {
    if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
      std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                      "creating cubic features for triples: ");
    }
    local_1f80._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffd158);
    while( true ) {
      local_1f88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffd158);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffd160,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffd158);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_1f80);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8));
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_1f80);
      std::__cxx11::string::operator=((string *)pbVar10,local_1fa8);
      std::__cxx11::string::~string(local_1fa8);
      if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
        ptVar18 = local_10 + 1;
        pbVar10 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_1f80);
        poVar5 = std::operator<<((ostream *)&(ptVar18->super_base_option).m_help.field_2,
                                 (string *)pbVar10);
        std::operator<<(poVar5," ");
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1f80);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1fe0,"error, cubic features must involve three sets.",&local_1fe1);
    INTERACTIONS::expand_interactions
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ptVar3,(size_t)required_length,err_msg);
    std::__cxx11::string::~string(local_1fe0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1fe1);
    local_1ff8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_ffffffffffffd158);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffd160,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffd158);
    local_2000 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_ffffffffffffd158);
    local_2008 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_ffffffffffffd158);
    __first._M_current._6_1_ = in_stack_ffffffffffffd1b6;
    __first._M_current._0_6_ = in_stack_ffffffffffffd1b0;
    __first._M_current._7_1_ = in_stack_ffffffffffffd1b7;
    local_2010 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffd1a7,in_stack_ffffffffffffd1a0),
                            in_stack_ffffffffffffd1b8,__first,in_stack_ffffffffffffd1a8);
    if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
      std::ostream::operator<<
                (&local_10[1].super_base_option.m_help.field_2,
                 std::endl<char,std::char_traits<char>>);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffd170);
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2030,"interactions",&local_2031);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_2030);
  std::__cxx11::string::~string(local_2030);
  std::allocator<char>::~allocator((allocator<char> *)&local_2031);
  uVar17 = (undefined1)((ulong)in_stack_ffffffffffffd2e8 >> 0x38);
  if ((bVar1 & 1) != 0) {
    if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
      std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                      "creating features for following interactions: ");
    }
    local_2040._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffd158);
    while( true ) {
      local_2048 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffd158);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffd160,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffd158);
      uVar17 = (undefined1)((ulong)in_stack_ffffffffffffd2e8 >> 0x38);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_2040);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8));
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_2040);
      std::__cxx11::string::operator=((string *)pbVar10,local_2068);
      std::__cxx11::string::~string(local_2068);
      if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
        ptVar18 = local_10 + 1;
        pbVar10 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_2040);
        poVar5 = std::operator<<((ostream *)&(ptVar18->super_base_option).m_help.field_2,
                                 (string *)pbVar10);
        std::operator<<(poVar5," ");
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_2040);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_20a0,"",&local_20a1);
    INTERACTIONS::expand_interactions
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ptVar3,(size_t)required_length,err_msg);
    std::__cxx11::string::~string(local_20a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_20a1);
    local_20b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_ffffffffffffd158);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffd160,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffd158);
    local_20c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_ffffffffffffd158);
    local_20c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_ffffffffffffd158);
    __first_00._M_current._6_1_ = in_stack_ffffffffffffd1b6;
    __first_00._M_current._0_6_ = in_stack_ffffffffffffd1b0;
    __first_00._M_current._7_1_ = in_stack_ffffffffffffd1b7;
    in_stack_ffffffffffffd2f0 =
         std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
         insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_ffffffffffffd1a7,in_stack_ffffffffffffd1a0),
                    in_stack_ffffffffffffd1b8,__first_00,in_stack_ffffffffffffd1a8);
    local_20d0 = in_stack_ffffffffffffd2f0._M_current;
    if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
      std::ostream::operator<<
                (&local_10[1].super_base_option.m_help.field_2,
                 std::endl<char,std::char_traits<char>>);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffd170);
  }
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_1e40);
  if (sVar4 != 0) {
    INTERACTIONS::sort_and_filter_duplicate_interactions
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffd2f0._M_current,(bool)uVar17,in_stack_ffffffffffffd2e0,
               in_stack_ffffffffffffd2d8);
    if (local_20d8 != 0) {
      poVar5 = std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                               "WARNING: duplicate namespace interactions were found. Removed: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_20d8);
      poVar5 = std::operator<<(poVar5,'.');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,
                               "You can use --leave_duplicate_interactions to disable this behaviour."
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    if (local_20e0 != 0) {
      poVar5 = std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                               "WARNING: some interactions contain duplicate characters and their characters order has been changed. Interactions affected: "
                              );
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_20e0);
      poVar5 = std::operator<<(poVar5,'.');
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&local_10[5].super_base_option.m_help.field_2 + 8));
    if (sVar4 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x13a206);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(in_stack_ffffffffffffd200,in_stack_ffffffffffffd1f8);
    local_20e8 = &local_1e40;
    local_20f0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffd158);
    local_20f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffd158);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffd160,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffd158), bVar2) {
      local_2100 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_20f0);
      local_2108 = std::__cxx11::string::size();
      if (local_2108 == 2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffd170,in_stack_ffffffffffffd168);
      }
      else if (local_2108 == 3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffd170,in_stack_ffffffffffffd168);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_20f0);
    }
  }
  plVar16 = local_8;
  for (local_2110 = 0; local_2110 < 0x100; local_2110 = local_2110 + 1) {
    *(undefined1 *)
     ((long)&local_10[5].m_default_value.
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr + local_2110 + 1) = 0;
    (&local_10[7].super_base_option.m_short_name.field_0x2)[local_2110] = 0;
  }
  *(undefined1 *)
   &local_10[5].m_default_value.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = 0;
  local_10[7].super_base_option.m_short_name.field_0x1 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2130,"ignore",&local_2131);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_2130);
  std::__cxx11::string::~string(local_2130);
  std::allocator<char>::~allocator((allocator<char> *)&local_2131);
  if ((bVar1 & 1) != 0) {
    *(undefined1 *)
     &local_10[5].m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = 1;
    local_2140._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffd158);
    while( true ) {
      local_2148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffd158);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffd160,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffd158);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_2140);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8));
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_2140);
      std::__cxx11::string::operator=((string *)pbVar10,local_2168);
      std::__cxx11::string::~string(local_2168);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_2140);
      local_2178 = std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffd160,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffd158);
      while( true ) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_2140);
        local_2180 = std::__cxx11::string::end();
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffd160,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffd158);
        ptVar18 = local_10;
        if (!bVar2) break;
        pbVar9 = (byte *)__gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_2170);
        *(undefined1 *)
         ((long)&ptVar18[5].m_default_value.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr + (ulong)*pbVar9 + 1) = 1;
        local_2188 = (char *)__gnu_cxx::
                             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)in_stack_ffffffffffffd168,
                                          (int)((ulong)in_stack_ffffffffffffd160 >> 0x20));
      }
      local_2190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffd168,
                                (int)((ulong)in_stack_ffffffffffffd160 >> 0x20));
    }
    if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
      std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                      "ignoring namespaces beginning with: ");
      local_2198 = local_c0;
      local_21a0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffd158);
      local_21a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffd158);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffd160,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffd158), bVar2) {
        local_21b8 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_21a0);
        local_21b0 = local_21b8;
        local_21c0._M_current = (char *)std::__cxx11::string::begin();
        local_21c8 = std::__cxx11::string::end();
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_ffffffffffffd160,
                                  (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_ffffffffffffd158), bVar2) {
          pcVar6 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_21c0);
          local_21c9 = *pcVar6;
          poVar5 = std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                                   local_21c9);
          std::operator<<(poVar5," ");
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_21c0);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_21a0);
      }
      std::ostream::operator<<
                (&local_10[1].super_base_option.m_help.field_2,
                 std::endl<char,std::char_traits<char>>);
    }
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_21f0,"ignore_linear",&local_21f1);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_21f0);
  std::__cxx11::string::~string(local_21f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_21f1);
  if ((bVar1 & 1) != 0) {
    local_10[7].super_base_option.m_short_name.field_0x1 = 1;
    local_2200._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffd158);
    while( true ) {
      local_2208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffd158);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffd160,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffd158);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_2200);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8));
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_2200);
      std::__cxx11::string::operator=((string *)pbVar10,local_2228);
      std::__cxx11::string::~string(local_2228);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_2200);
      local_2238 = std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffd160,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffd158);
      while( true ) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_2200);
        local_2240 = std::__cxx11::string::end();
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffd160,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffd158);
        ptVar18 = local_10;
        if (!bVar2) break;
        pbVar9 = (byte *)__gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_2230);
        (&ptVar18[7].super_base_option.m_short_name.field_0x2)[*pbVar9] = 1;
        local_2248 = (char *)__gnu_cxx::
                             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)in_stack_ffffffffffffd168,
                                          (int)((ulong)in_stack_ffffffffffffd160 >> 0x20));
      }
      local_2250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffd168,
                                (int)((ulong)in_stack_ffffffffffffd160 >> 0x20));
    }
    if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
      std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                      "ignoring linear terms for namespaces beginning with: ");
      local_2258 = local_d8;
      local_2260._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffd158);
      local_2268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffd158);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffd160,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffd158), bVar2) {
        local_2278 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_2260);
        local_2270 = local_2278;
        local_2280._M_current = (char *)std::__cxx11::string::begin();
        local_2288 = std::__cxx11::string::end();
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_ffffffffffffd160,
                                  (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_ffffffffffffd158), bVar2) {
          pcVar6 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_2280);
          local_2289 = *pcVar6;
          poVar5 = std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                                   local_2289);
          std::operator<<(poVar5," ");
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_2280);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_2260);
      }
      std::ostream::operator<<
                (&local_10[1].super_base_option.m_help.field_2,
                 std::endl<char,std::char_traits<char>>);
    }
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_22b0,"keep",&local_22b1);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_22b0);
  std::__cxx11::string::~string(local_22b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_22b1);
  if ((bVar1 & 1) != 0) {
    for (local_22c0 = 0; local_22c0 < 0x100; local_22c0 = local_22c0 + 1) {
      *(undefined1 *)
       ((long)&local_10[5].m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr + local_22c0 + 1) = 1;
    }
    *(undefined1 *)
     &local_10[5].m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = 1;
    local_22c8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffd158);
    while( true ) {
      local_22d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffd158);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffd160,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffd158);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_22c8);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8));
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_22c8);
      std::__cxx11::string::operator=((string *)pbVar10,local_22f0);
      std::__cxx11::string::~string(local_22f0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_22c8);
      local_2300 = std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffd160,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffd158);
      while( true ) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_22c8);
        local_2308 = std::__cxx11::string::end();
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffd160,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffd158);
        if (!bVar2) break;
        ptVar18 = local_10;
        pbVar9 = (byte *)__gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_22f8);
        *(undefined1 *)
         ((long)&ptVar18[5].m_default_value.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr + (ulong)*pbVar9 + 1) = 0;
        local_2310 = (char *)__gnu_cxx::
                             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)in_stack_ffffffffffffd168,
                                          (int)((ulong)in_stack_ffffffffffffd160 >> 0x20));
      }
      local_2318 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffd168,
                                (int)((ulong)in_stack_ffffffffffffd160 >> 0x20));
    }
    if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
      std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                      "using namespaces beginning with: ");
      local_2320 = local_f0;
      local_2328._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffd158);
      local_2330 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffd158);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffd160,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffd158), bVar2) {
        local_2340 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_2328);
        local_2338 = local_2340;
        local_2348._M_current = (char *)std::__cxx11::string::begin();
        local_2350 = std::__cxx11::string::end();
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_ffffffffffffd160,
                                  (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_ffffffffffffd158), bVar2) {
          pcVar6 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_2348);
          local_2351 = *pcVar6;
          poVar5 = std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                                   local_2351);
          std::operator<<(poVar5," ");
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_2348);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_2328);
      }
      std::ostream::operator<<
                (&local_10[1].super_base_option.m_help.field_2,
                 std::endl<char,std::char_traits<char>>);
    }
  }
  *(undefined1 *)((long)&local_10[9].super_base_option.m_name._M_string_length + 2) = 0;
  paVar15 = &local_2379;
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2378,"redefine",paVar15);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_2378);
  std::__cxx11::string::~string(local_2378);
  std::allocator<char>::~allocator((allocator<char> *)&local_2379);
  if ((bVar1 & 1) != 0) {
    for (local_2388 = 0; local_2388 < 0x100; local_2388 = local_2388 + 1) {
      *(char *)((long)&local_10[9].super_base_option.m_name._M_string_length + local_2388 + 3) =
           (char)local_2388;
    }
    local_2390._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffd158);
    while( true ) {
      local_2398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffd158);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffd160,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffd158);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_2390);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8));
      uVar12 = std::__cxx11::string::length();
      local_23c8 = 0;
      bVar2 = false;
      local_23ca = ' ';
      for (local_23d8 = 0; local_23d8 < uVar12; local_23d8 = local_23d8 + 1) {
        if (bVar2) {
          if (2 < local_23d8) {
            puVar7 = (uchar *)std::__cxx11::string::operator[]((ulong)local_23b8);
            local_23ca = *puVar7;
          }
          break;
        }
        pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_23b8);
        if (*pcVar11 == ':') {
          local_23c8 = local_23d8 + 1;
        }
        else {
          pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_23b8);
          if ((*pcVar11 == '=') && (local_23c8 == local_23d8)) {
            bVar2 = true;
          }
        }
      }
      iVar14 = (int)((ulong)in_stack_ffffffffffffd180 >> 0x20);
      if (!bVar2) {
        std::__cxx11::stringstream::stringstream(local_2560);
        std::operator<<((ostream *)(local_2560 + 0x10),
                        "argument of --redefine is malformed. Valid format is N:=S, :=S or N:=");
        local_2581 = 1;
        uVar8 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_ffffffffffffd190,in_stack_ffffffffffffd188,iVar14,
                   in_stack_ffffffffffffd178);
        local_2581 = 0;
        __cxa_throw(uVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      local_23c8 = local_23c8 + 1;
      if (3 < local_23c8) {
        poVar5 = std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                                 "WARNING: multiple namespaces are used in target part of --redefine argument. Only first one (\'"
                                );
        poVar5 = std::operator<<(poVar5,local_23ca);
        in_stack_ffffffffffffd1e8 =
             (string *)std::operator<<(poVar5,"\') will be used as target namespace.");
        std::ostream::operator<<(in_stack_ffffffffffffd1e8,std::endl<char,std::char_traits<char>>);
      }
      *(undefined1 *)((long)&local_10[9].super_base_option.m_name._M_string_length + 2) = 1;
      if (local_23c8 != uVar12) {
LAB_0013b47d:
        local_2590 = local_23c8;
        if (local_2590 < uVar12) {
          pbVar9 = (byte *)std::__cxx11::string::operator[]((ulong)local_23b8);
          local_2591 = *pbVar9;
          if (local_2591 != 0x3a) goto code_r0x0013b4d0;
          for (local_25a0 = 0; local_25a0 < 0x100; local_25a0 = local_25a0 + 1) {
            *(uchar *)((long)&local_10[9].super_base_option.m_name._M_string_length + local_25a0 + 3
                      ) = local_23ca;
          }
        }
        goto LAB_0013b55d;
      }
      local_10[9].super_base_option.m_help.field_0x3 = local_23ca;
LAB_0013b55d:
      std::__cxx11::string::~string(local_23b8);
      local_25a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffd168,
                                (int)((ulong)in_stack_ffffffffffffd160 >> 0x20));
    }
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_25c8,"dictionary",&local_25c9);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_25c8);
  std::__cxx11::string::~string(local_25c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_25c9);
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_25f0,"dictionary_path",&local_25f1);
    bVar1 = (**(code **)(*local_8 + 8))(local_8,local_25f0);
    std::__cxx11::string::~string(local_25f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_25f1);
    if ((bVar1 & 1) != 0) {
      local_2600 = local_138;
      local_2608._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffd158);
      local_2610 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffd158);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffd160,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffd158), bVar2) {
        pbVar10 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_2608);
        std::__cxx11::string::string(local_2630,(string *)pbVar10);
        std::__cxx11::string::string(local_2650,local_2630);
        bVar1 = directory_exists(in_stack_ffffffffffffd1e8);
        std::__cxx11::string::~string(local_2650);
        if ((bVar1 & 1) != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffd170,in_stack_ffffffffffffd168);
        }
        std::__cxx11::string::~string(local_2630);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_2608);
      }
    }
    paVar15 = &local_2671;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2670,".",paVar15);
    bVar1 = directory_exists(in_stack_ffffffffffffd1e8);
    std::__cxx11::string::~string(local_2670);
    std::allocator<char>::~allocator((allocator<char> *)&local_2671);
    if ((bVar1 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2698,".",&local_2699);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
      std::__cxx11::string::~string(local_2698);
      std::allocator<char>::~allocator((allocator<char> *)&local_2699);
    }
    pcVar11 = getenv("PATH");
    paVar15 = &local_26c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_26c0,pcVar11,paVar15);
    std::allocator<char>::~allocator((allocator<char> *)&local_26c1);
    local_26c2 = 0x3a;
    uVar12 = std::__cxx11::string::empty();
    if ((uVar12 & 1) == 0) {
      local_26d0 = 0;
      local_26d8 = std::__cxx11::string::find((char)local_26c0,0x3a);
      while (local_26d8 != -1) {
        std::__cxx11::string::substr((ulong)local_26f8,(ulong)local_26c0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
        std::__cxx11::string::~string(local_26f8);
        local_26d0 = local_26d8 + 1;
        local_26d8 = std::__cxx11::string::find((char)local_26c0,0x3a);
      }
      in_stack_ffffffffffffd170 = (typed_option<unsigned_int> *)&local_10[0x2c].m_value;
      std::__cxx11::string::substr((ulong)local_2718,(ulong)local_26c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffd160,in_stack_ffffffffffffd158);
      std::__cxx11::string::~string(local_2718);
    }
    local_2720 = 0;
    while (uVar12 = local_2720,
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_120), uVar12 < sVar4) {
      in_stack_ffffffffffffd160 = local_10;
      pvVar13 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](local_120,local_2720);
      std::__cxx11::string::string(local_2740,(string *)pvVar13);
      parse_dictionary_argument(in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98);
      std::__cxx11::string::~string(local_2740);
      local_2720 = local_2720 + 1;
    }
    std::__cxx11::string::~string(local_26c0);
  }
  if ((local_139 & 1) != 0) {
    local_10[0x53].super_base_option.field_0x74 = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd170);
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffd160);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_160);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffd170);
  std::__cxx11::string::~string(local_30);
  return;
code_r0x0013b4d0:
  *(uchar *)((long)&local_10[9].super_base_option.m_name._M_string_length + (ulong)local_2591 + 3) =
       local_23ca;
  local_23c8 = local_2590 + 1;
  goto LAB_0013b47d;
}

Assistant:

void parse_feature_tweaks(options_i& options, vw& all)
{
  string hash_function("strings");
  uint32_t new_bits;
  vector<string> spelling_ns;
  vector<string> quadratics;
  vector<string> cubics;
  vector<string> interactions;
  vector<string> ignores;
  vector<string> ignore_linears;
  vector<string> keeps;
  vector<string> redefines;
  vector<string> dictionary_nses;

  vector<string> dictionary_path;

  bool noconstant;
  bool leave_duplicate_interactions;
  std::string affix;
  std::string q_colon;

  option_group_definition feature_options("Feature options");
  feature_options
      .add(make_option("hash", hash_function).keep().help("how to hash the features. Available options: strings, all"))
      .add(make_option("hash_seed", all.hash_seed).keep().default_value(0).help("seed for hash function"))
      .add(make_option("ignore", ignores).keep().help("ignore namespaces beginning with character <arg>"))
      .add(make_option("ignore_linear", ignore_linears)
               .keep()
               .help("ignore namespaces beginning with character <arg> for linear terms only"))
      .add(make_option("keep", keeps).keep().help("keep namespaces beginning with character <arg>"))
      .add(make_option("redefine", redefines)
               .keep()
               .help("redefine namespaces beginning with characters of string S as namespace N. <arg> shall be in form "
                     "'N:=S' where := is operator. Empty N or S are treated as default namespace. Use ':' as a "
                     "wildcard in S.")
               .keep())
      .add(make_option("bit_precision", new_bits).short_name("b").help("number of bits in the feature table"))
      .add(make_option("noconstant", noconstant).help("Don't add a constant feature"))
      .add(make_option("constant", all.initial_constant).short_name("C").help("Set initial value of constant"))
      .add(make_option("ngram", all.ngram_strings)
               .help("Generate N grams. To generate N grams for a single namespace 'foo', arg should be fN."))
      .add(make_option("skips", all.skip_strings)
               .help("Generate skips in N grams. This in conjunction with the ngram tag can be used to generate "
                     "generalized n-skip-k-gram. To generate n-skips for a single namespace 'foo', arg should be fN."))
      .add(make_option("feature_limit", all.limit_strings)
               .help("limit to N features. To apply to a single namespace 'foo', arg should be fN"))
      .add(make_option("affix", affix)
               .keep()
               .help("generate prefixes/suffixes of features; argument '+2a,-3b,+1' means generate 2-char prefixes for "
                     "namespace a, 3-char suffixes for b and 1 char prefixes for default namespace"))
      .add(make_option("spelling", spelling_ns)
               .keep()
               .help("compute spelling features for a give namespace (use '_' for default namespace)"))
      .add(make_option("dictionary", dictionary_nses)
               .keep()
               .help("read a dictionary for additional features (arg either 'x:file' or just 'file')"))
      .add(make_option("dictionary_path", dictionary_path)
               .help("look in this directory for dictionaries; defaults to current directory or env{PATH}"))
      .add(make_option("interactions", interactions)
               .keep()
               .help("Create feature interactions of any level between namespaces."))
      .add(make_option("permutations", all.permutations)
               .help("Use permutations instead of combinations for feature interactions of same namespace."))
      .add(make_option("leave_duplicate_interactions", leave_duplicate_interactions)
               .help("Don't remove interactions with duplicate combinations of namespaces. For ex. this is a "
                     "duplicate: '-q ab -q ba' and a lot more in '-q ::'."))
      .add(make_option("quadratic", quadratics).short_name("q").keep().help("Create and use quadratic features"))
      // TODO this option is unused - remove?
      .add(make_option("q:", q_colon).help(": corresponds to a wildcard for all printable characters"))
      .add(make_option("cubic", cubics).keep().help("Create and use cubic features"));
  options.add_and_parse(feature_options);

  // feature manipulation
  all.p->hasher = getHasher(hash_function);

  if (options.was_supplied("spelling"))
  {
    for (size_t id = 0; id < spelling_ns.size(); id++)
    {
      spelling_ns[id] = spoof_hex_encoded_namespaces(spelling_ns[id]);
      if (spelling_ns[id][0] == '_')
        all.spelling_features[(unsigned char)' '] = true;
      else
        all.spelling_features[(size_t)spelling_ns[id][0]] = true;
    }
  }

  if (options.was_supplied("affix"))
    parse_affix_argument(all, spoof_hex_encoded_namespaces(affix));

  if (options.was_supplied("ngram"))
  {
    if (options.was_supplied("sort_features"))
      THROW("ngram is incompatible with sort_features.");

    for (size_t i = 0; i < all.ngram_strings.size(); i++)
      all.ngram_strings[i] = spoof_hex_encoded_namespaces(all.ngram_strings[i]);
    compile_gram(all.ngram_strings, all.ngram, (char*)"grams", all.quiet);
  }

  if (options.was_supplied("skips"))
  {
    if (!options.was_supplied("ngram"))
      THROW("You can not skip unless ngram is > 1");

    for (size_t i = 0; i < all.skip_strings.size(); i++)
      all.skip_strings[i] = spoof_hex_encoded_namespaces(all.skip_strings[i]);
    compile_gram(all.skip_strings, all.skips, (char*)"skips", all.quiet);
  }

  if (options.was_supplied("feature_limit"))
    compile_limits(all.limit_strings, all.limit, all.quiet);

  if (options.was_supplied("bit_precision"))
  {
    if (all.default_bits == false && new_bits != all.num_bits)
      THROW("Number of bits is set to " << new_bits << " and " << all.num_bits
                                        << " by argument and model.  That does not work.");

    all.default_bits = false;
    all.num_bits = new_bits;

    VW::validate_num_bits(all);
  }

  // prepare namespace interactions
  std::vector<std::string> expanded_interactions;

  if ( ( ((!all.pairs.empty() || !all.triples.empty() || !all.interactions.empty()) && /*data was restored from old model file directly to v_array and will be overriden automatically*/
          (options.was_supplied("quadratic") || options.was_supplied("cubic") || options.was_supplied("interactions")) ) )
       ||
       interactions_settings_doubled /*settings were restored from model file to file_options and overriden by params from command line*/)
  {
    all.trace_message << "WARNING: model file has set of {-q, --cubic, --interactions} settings stored, but they'll be "
                         "OVERRIDEN by set of {-q, --cubic, --interactions} settings from command line."
                      << endl;

    // in case arrays were already filled in with values from old model file - reset them
    if (!all.pairs.empty())
      all.pairs.clear();
    if (!all.triples.empty())
      all.triples.clear();
    if (!all.interactions.empty())
      all.interactions.clear();
  }

  if (options.was_supplied("quadratic"))
  {
    if (!all.quiet)
      all.trace_message << "creating quadratic features for pairs: ";

    for (vector<string>::iterator i = quadratics.begin(); i != quadratics.end(); ++i)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      if (!all.quiet)
        all.trace_message << *i << " ";
    }

    expanded_interactions =
        INTERACTIONS::expand_interactions(quadratics, 2, "error, quadratic features must involve two sets.");

    if (!all.quiet)
      all.trace_message << endl;
  }

  if (options.was_supplied("cubic"))
  {
    if (!all.quiet)
      all.trace_message << "creating cubic features for triples: ";
    for (vector<string>::iterator i = cubics.begin(); i != cubics.end(); ++i)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      if (!all.quiet)
        all.trace_message << *i << " ";
    }

    std::vector<std::string> exp_cubic =
        INTERACTIONS::expand_interactions(cubics, 3, "error, cubic features must involve three sets.");
    expanded_interactions.insert(std::begin(expanded_interactions), std::begin(exp_cubic), std::end(exp_cubic));

    if (!all.quiet)
      all.trace_message << endl;
  }

  if (options.was_supplied("interactions"))
  {
    if (!all.quiet)
      all.trace_message << "creating features for following interactions: ";
    for (vector<string>::iterator i = interactions.begin(); i != interactions.end(); ++i)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      if (!all.quiet)
        all.trace_message << *i << " ";
    }

    std::vector<std::string> exp_inter = INTERACTIONS::expand_interactions(interactions, 0, "");
    expanded_interactions.insert(std::begin(expanded_interactions), std::begin(exp_inter), std::end(exp_inter));

    if (!all.quiet)
      all.trace_message << endl;
  }

  if (expanded_interactions.size() > 0)
  {
    size_t removed_cnt;
    size_t sorted_cnt;
    INTERACTIONS::sort_and_filter_duplicate_interactions(
        expanded_interactions, !leave_duplicate_interactions, removed_cnt, sorted_cnt);

    if (removed_cnt > 0)
      all.trace_message << "WARNING: duplicate namespace interactions were found. Removed: " << removed_cnt << '.'
                        << endl
                        << "You can use --leave_duplicate_interactions to disable this behaviour." << endl;
    if (sorted_cnt > 0)
      all.trace_message << "WARNING: some interactions contain duplicate characters and their characters order has "
                           "been changed. Interactions affected: "
                        << sorted_cnt << '.' << endl;

    if (all.interactions.size() > 0)
    {
      // should be empty, but just in case...
      all.interactions.clear();
    }

    all.interactions = expanded_interactions;

    // copy interactions of size 2 and 3 to old vectors for backward compatibility
    for (auto& i : expanded_interactions)
    {
      const size_t len = i.size();
      if (len == 2)
        all.pairs.push_back(i);
      else if (len == 3)
        all.triples.push_back(i);
    }
  }

  for (size_t i = 0; i < 256; i++)
  {
    all.ignore[i] = false;
    all.ignore_linear[i] = false;
  }
  all.ignore_some = false;
  all.ignore_some_linear = false;

  if (options.was_supplied("ignore"))
  {
    all.ignore_some = true;

    for (vector<string>::iterator i = ignores.begin(); i != ignores.end(); i++)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      for (string::const_iterator j = i->begin(); j != i->end(); j++) all.ignore[(size_t)(unsigned char)*j] = true;
    }

    if (!all.quiet)
    {
      all.trace_message << "ignoring namespaces beginning with: ";
      for (auto const& ignore : ignores)
        for (auto const character : ignore) all.trace_message << character << " ";

      all.trace_message << endl;
    }
  }

  if (options.was_supplied("ignore_linear"))
  {
    all.ignore_some_linear = true;

    for (vector<string>::iterator i = ignore_linears.begin(); i != ignore_linears.end(); i++)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      for (string::const_iterator j = i->begin(); j != i->end(); j++)
        all.ignore_linear[(size_t)(unsigned char)*j] = true;
    }

    if (!all.quiet)
    {
      all.trace_message << "ignoring linear terms for namespaces beginning with: ";
      for (auto const& ignore : ignore_linears)
        for (auto const character : ignore) all.trace_message << character << " ";

      all.trace_message << endl;
    }
  }

  if (options.was_supplied("keep"))
  {
    for (size_t i = 0; i < 256; i++) all.ignore[i] = true;

    all.ignore_some = true;

    for (vector<string>::iterator i = keeps.begin(); i != keeps.end(); i++)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      for (string::const_iterator j = i->begin(); j != i->end(); j++) all.ignore[(size_t)(unsigned char)*j] = false;
    }

    if (!all.quiet)
    {
      all.trace_message << "using namespaces beginning with: ";
      for (auto const& keep : keeps)
        for (auto const character : keep) all.trace_message << character << " ";

      all.trace_message << endl;
    }
  }

  // --redefine param code
  all.redefine_some = false;  // false by default

  if (options.was_supplied("redefine"))
  {
    // initail values: i-th namespace is redefined to i itself
    for (size_t i = 0; i < 256; i++) all.redefine[i] = (unsigned char)i;

    // note: --redefine declaration order is matter
    // so --redefine :=L --redefine ab:=M  --ignore L  will ignore all except a and b under new M namspace

    for (vector<string>::iterator arg_iter = redefines.begin(); arg_iter != redefines.end(); arg_iter++)
    {
      string argument = spoof_hex_encoded_namespaces(*arg_iter);
      size_t arg_len = argument.length();

      size_t operator_pos = 0;  // keeps operator pos + 1 to stay unsigned type
      bool operator_found = false;
      unsigned char new_namespace = ' ';

      // let's find operator ':=' position in N:=S
      for (size_t i = 0; i < arg_len; i++)
      {
        if (operator_found)
        {
          if (i > 2)
          {
            new_namespace = argument[0];
          }  // N is not empty
          break;
        }
        else if (argument[i] == ':')
          operator_pos = i + 1;
        else if ((argument[i] == '=') && (operator_pos == i))
          operator_found = true;
      }

      if (!operator_found)
        THROW("argument of --redefine is malformed. Valid format is N:=S, :=S or N:=");

      if (++operator_pos > 3)  // seek operator end
        all.trace_message
            << "WARNING: multiple namespaces are used in target part of --redefine argument. Only first one ('"
            << new_namespace << "') will be used as target namespace." << endl;

      all.redefine_some = true;

      // case ':=S' doesn't require any additional code as new_namespace = ' ' by default

      if (operator_pos == arg_len)  // S is empty, default namespace shall be used
        all.redefine[(int)' '] = new_namespace;
      else
        for (size_t i = operator_pos; i < arg_len; i++)
        {
          // all namespaces from S are redefined to N
          unsigned char c = argument[i];
          if (c != ':')
            all.redefine[c] = new_namespace;
          else
          {
            // wildcard found: redefine all except default and break
            for (size_t i = 0; i < 256; i++) all.redefine[i] = new_namespace;
            break;  // break processing S
          }
        }
    }
  }

  if (options.was_supplied("dictionary"))
  {
    if (options.was_supplied("dictionary_path"))
      for (string path : dictionary_path)
        if (directory_exists(path))
          all.dictionary_path.push_back(path);
    if (directory_exists("."))
      all.dictionary_path.push_back(".");

    const std::string PATH = getenv("PATH");
#if _WIN32
    const char delimiter = ';';
#else
    const char delimiter = ':';
#endif
    if (!PATH.empty())
    {
      size_t previous = 0;
      size_t index = PATH.find(delimiter);
      while (index != string::npos)
      {
        all.dictionary_path.push_back(PATH.substr(previous, index - previous));
        previous = index + 1;
        index = PATH.find(delimiter, previous);
      }
      all.dictionary_path.push_back(PATH.substr(previous));
    }

    for (size_t id = 0; id < dictionary_nses.size(); id++) parse_dictionary_argument(all, dictionary_nses[id]);
  }

  if (noconstant)
    all.add_constant = false;
}